

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::AttachComments
          (LocationRecorder *this,string *leading,string *trailing)

{
  Location *pLVar1;
  uint uVar2;
  LogMessage *pLVar3;
  string *psVar4;
  LogFinisher local_59;
  LogMessage local_58;
  
  uVar2 = this->location_->_has_bits_[0];
  if ((uVar2 & 4) != 0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/compiler/parser.cc"
               ,0x16b);
    pLVar3 = internal::LogMessage::operator<<
                       (&local_58,"CHECK failed: !location_->has_leading_comments(): ");
    internal::LogFinisher::operator=(&local_59,pLVar3);
    internal::LogMessage::~LogMessage(&local_58);
    uVar2 = this->location_->_has_bits_[0];
  }
  if ((uVar2 & 8) != 0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/compiler/parser.cc"
               ,0x16c);
    pLVar3 = internal::LogMessage::operator<<
                       (&local_58,"CHECK failed: !location_->has_trailing_comments(): ");
    internal::LogFinisher::operator=(&local_59,pLVar3);
    internal::LogMessage::~LogMessage(&local_58);
  }
  if (leading->_M_string_length != 0) {
    pLVar1 = this->location_;
    pLVar1->_has_bits_[0] = pLVar1->_has_bits_[0] | 4;
    psVar4 = pLVar1->leading_comments_;
    if (psVar4 == (string *)&internal::kEmptyString_abi_cxx11_) {
      psVar4 = (string *)operator_new(0x20);
      (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
      psVar4->_M_string_length = 0;
      (psVar4->field_2)._M_local_buf[0] = '\0';
      pLVar1->leading_comments_ = psVar4;
    }
    std::__cxx11::string::swap((string *)psVar4);
  }
  if (trailing->_M_string_length != 0) {
    pLVar1 = this->location_;
    pLVar1->_has_bits_[0] = pLVar1->_has_bits_[0] | 8;
    psVar4 = pLVar1->trailing_comments_;
    if (psVar4 == (string *)&internal::kEmptyString_abi_cxx11_) {
      psVar4 = (string *)operator_new(0x20);
      (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
      psVar4->_M_string_length = 0;
      (psVar4->field_2)._M_local_buf[0] = '\0';
      pLVar1->trailing_comments_ = psVar4;
    }
    std::__cxx11::string::swap((string *)psVar4);
  }
  return;
}

Assistant:

void Parser::LocationRecorder::AttachComments(
    string* leading, string* trailing) const {
  GOOGLE_CHECK(!location_->has_leading_comments());
  GOOGLE_CHECK(!location_->has_trailing_comments());

  if (!leading->empty()) {
    location_->mutable_leading_comments()->swap(*leading);
  }
  if (!trailing->empty()) {
    location_->mutable_trailing_comments()->swap(*trailing);
  }
}